

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long in_RSI;
  int in_EDI;
  NLSolver nlsol;
  NLUtils utils;
  ExampleSOLHandler esolh;
  ExampleNLFeeder nlf;
  ExampleModel emdl;
  string stub;
  bool binary;
  string sopts;
  string solver;
  NLSolver *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  NLSolver *this;
  NLSolver *this_00;
  ExampleNLFeeder *local_3e8;
  undefined7 in_stack_fffffffffffffc20;
  undefined1 in_stack_fffffffffffffc27;
  undefined1 uVar3;
  char *in_stack_fffffffffffffc28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char *local_3c8;
  NLUtils *put;
  char *this_02;
  string local_3a0 [104];
  string *in_stack_fffffffffffffcc8;
  ExampleSOLHandler *in_stack_fffffffffffffcd0;
  NLUtils local_2b8;
  ExampleSOLHandler local_2a8;
  ExampleNLFeeder local_2a0 [8];
  ExampleModel *in_stack_fffffffffffffde0;
  undefined1 local_91 [39];
  byte local_6a;
  undefined1 local_69 [56];
  undefined1 local_31 [33];
  long local_10;
  int local_8;
  uint local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    printf("%s\n",
           "AMPL NL writer example.\nUsage:\n  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\nwhere <solver> is ipopt, gurobi, minos, ...;\nbinary/text is the NL format (default: binary.)\nExamples:\n  <this_exe> ipopt \"\" text /tmp/stub\n  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\""
          );
    exit(0);
  }
  if (in_EDI < 2) {
    this_02 = "minos";
  }
  else {
    this_02 = *(char **)(in_RSI + 8);
  }
  put = (NLUtils *)local_31;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  if (local_8 < 3) {
    local_3c8 = "";
  }
  else {
    local_3c8 = *(char **)(local_10 + 0x10);
  }
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,local_3c8,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
  std::allocator<char>::~allocator((allocator<char> *)local_69);
  uVar3 = true;
  if (3 < local_8) {
    iVar2 = strcmp("text",*(char **)(local_10 + 0x18));
    uVar3 = iVar2 != 0;
  }
  if (local_8 < 5) {
    local_3e8 = (ExampleNLFeeder *)0x14126d;
  }
  else {
    local_3e8 = *(ExampleNLFeeder **)(local_10 + 0x20);
  }
  this_00 = (NLSolver *)local_91;
  local_6a = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,local_3c8,(allocator<char> *)CONCAT17(uVar3,in_stack_fffffffffffffc20));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  ExampleModel::ExampleModel(in_stack_fffffffffffffde0);
  ExampleNLFeeder::ExampleNLFeeder(local_2a0,(ExampleModel *)(local_2a0 + 1),(bool)(local_6a & 1));
  ExampleSOLHandler::ExampleSOLHandler(&local_2a8,(ExampleModel *)(local_2a0 + 1));
  this = (NLSolver *)&local_2b8;
  mp::NLUtils::NLUtils((NLUtils *)this);
  mp::NLSolver::NLSolver((NLSolver *)this_02,put);
  std::__cxx11::string::string(local_3a0,(string *)(local_91 + 1));
  mp::NLSolver::SetFileStub
            (this,(string *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8));
  std::__cxx11::string::~string(local_3a0);
  bVar1 = mp::NLSolver::Solve<ExampleNLFeeder,ExampleSOLHandler>
                    (this_00,local_3e8,(ExampleSOLHandler *)this,
                     (string *)CONCAT17(in_stack_fffffffffffffbff,in_stack_fffffffffffffbf8),
                     (string *)in_stack_fffffffffffffbf0);
  if (bVar1) {
    ExampleSOLHandler::PrintSolution(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  }
  else {
    in_stack_fffffffffffffbf0 = (NLSolver *)mp::NLSolver::GetErrorMessage((NLSolver *)0x104e9b);
    printf("%s\n",in_stack_fffffffffffffbf0);
  }
  local_4 = (uint)!bVar1;
  mp::NLSolver::~NLSolver(in_stack_fffffffffffffbf0);
  mp::NLUtils::~NLUtils(&local_2b8);
  ExampleModel::~ExampleModel((ExampleModel *)CONCAT17(uVar3,in_stack_fffffffffffffc20));
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::__cxx11::string::~string((string *)(local_69 + 1));
  std::__cxx11::string::~string((string *)(local_31 + 1));
  return local_4;
}

Assistant:

int main(int argc, const char* const* argv) {
  if (argc<2) {
    printf("%s\n",
           "AMPL NL writer example.\n"
           "Usage:\n"
           "  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\n"
           "where <solver> is ipopt, gurobi, minos, ...;\n"
           "binary/text is the NL format (default: binary.)\n"
           "Examples:\n"
           "  <this_exe> ipopt \"\" text /tmp/stub\n"
           "  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\"");
    exit(0);
  }
  std::string solver = (argc>1) ? argv[1] : "minos";
  std::string sopts = (argc>2) ? argv[2] : "";
  bool binary = (argc<=3) || std::strcmp("text", argv[3]);
  std::string stub = (argc>4) ? argv[4] : "";

  ExampleModel emdl;
  ExampleNLFeeder nlf(emdl, binary);
  ExampleSOLHandler esolh(emdl);
  mp::NLUtils utils;

  mp::NLSolver nlsol(&utils);
  nlsol.SetFileStub(stub);
  if (!nlsol.Solve(nlf, esolh, solver, sopts)) {
    printf("%s\n", nlsol.GetErrorMessage());
    return EXIT_FAILURE;
  } else {
    esolh.PrintSolution(stub);
  }

  return EXIT_SUCCESS;
}